

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Rsa.cpp
# Opt level: O3

bool __thiscall
axl::cry::Rsa::signHash
          (Rsa *this,int type,Array<char,_axl::sl::ArrayDetails<char>_> *signature,void *hash,
          size_t hashSize)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t count;
  char *signatureBuffer;
  
  iVar3 = RSA_size((RSA *)(this->super_Handle<rsa_st_*,_axl::cry::FreeRsa,_axl::sl::Zero<rsa_st_*>_>
                          ).m_h);
  bVar1 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::
          setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(signature,(long)iVar3);
  if (bVar1) {
    bVar2 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::ensureExclusive(signature);
    bVar1 = false;
    if (bVar2) {
      signatureBuffer = (signature->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p;
    }
    else {
      signatureBuffer = (char *)0x0;
    }
    count = signHash(this,type,signatureBuffer,(long)iVar3,hash,hashSize);
    if (count != 0xffffffffffffffff) {
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::
      setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(signature,count);
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
Rsa::signHash(
	int type,
	sl::Array<char>* signature,
	const void* hash,
	size_t hashSize
) {
	size_t signatureBufferSize = getSize();
	bool result = signature->setCount(signatureBufferSize);
	if (!result)
		return false;

	size_t size = signHash(type, signature->p(), signatureBufferSize, hash, hashSize);
	if (size == -1)
		return false;

	ASSERT(size <= signatureBufferSize);
	signature->setCount(size);
	return true;
}